

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O0

FutexResult
nativeFutexWaitImpl(void *addr,uint32_t expected,time_point *absSystemTime,time_point *absSteadyTime
                   ,uint32_t waitMask)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long in_RCX;
  duration *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  timespec tVar4;
  int rv;
  timespec *timeout;
  timespec ts;
  int op;
  __time_t local_70;
  __syscall_slong_t local_68;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffffa0;
  __time_t local_58;
  __syscall_slong_t local_50;
  __time_t *local_48;
  __time_t local_40;
  __syscall_slong_t local_38;
  uint local_30;
  undefined4 local_2c;
  uint local_14;
  undefined8 local_10;
  FutexResult local_4;
  
  if (in_RDX != (duration *)0x0 && in_RCX != 0) {
    __assert_fail("absSystemTime == nullptr || absSteadyTime == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                  ,0x45,
                  "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                 );
  }
  local_30 = 0x89;
  local_48 = (__time_t *)0x0;
  local_2c = in_R8D;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RDX == (duration *)0x0) {
    if (in_RCX != 0) {
      tVar4 = timeSpecFromTimePoint<std::chrono::_V2::steady_clock>(in_stack_ffffffffffffffa0);
      local_70 = tVar4.tv_sec;
      local_40 = local_70;
      local_68 = tVar4.tv_nsec;
      local_38 = local_68;
      local_48 = &local_40;
    }
  }
  else {
    local_30 = 0x189;
    tVar4 = timeSpecFromTimePoint<std::chrono::_V2::system_clock>
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        )in_RDX->__r);
    local_58 = tVar4.tv_sec;
    local_40 = local_58;
    local_50 = tVar4.tv_nsec;
    local_38 = local_50;
    local_48 = &local_40;
  }
  lVar2 = syscall(0xca,local_10,(ulong)local_30,(ulong)local_14,local_48,0,local_2c);
  if ((int)lVar2 == 0) {
    local_4 = AWOKEN;
  }
  else {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 == 4) {
      local_4 = INTERRUPTED;
    }
    else if (iVar1 == 0xb) {
      local_4 = VALUE_CHANGED;
    }
    else {
      if (iVar1 != 0x6e) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                      ,0x6f,
                      "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                     );
      }
      if (local_48 == (__time_t *)0x0) {
        __assert_fail("timeout != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/r10a[P]Event-Counts/Futex.cpp"
                      ,0x68,
                      "FutexResult nativeFutexWaitImpl(const void *, uint32_t, const system_clock::time_point *, const steady_clock::time_point *, uint32_t)"
                     );
      }
      local_4 = TIMEDOUT;
    }
  }
  return local_4;
}

Assistant:

FutexResult nativeFutexWaitImpl(
        const void *addr,
        uint32_t expected,
        system_clock::time_point const *absSystemTime,
        steady_clock::time_point const *absSteadyTime,
        uint32_t waitMask) {
    assert(absSystemTime == nullptr || absSteadyTime == nullptr);

#ifndef PSHARED
    int op = FUTEX_WAIT_BITSET | FUTEX_PRIVATE_FLAG;
#else
    int op = FUTEX_WAIT_BITSET;
#endif
    struct timespec ts;
    struct timespec *timeout = nullptr;

    if (absSystemTime != nullptr) {
        op |= FUTEX_CLOCK_REALTIME;
        ts = timeSpecFromTimePoint(*absSystemTime);
        timeout = &ts;
    } else if (absSteadyTime != nullptr) {
        ts = timeSpecFromTimePoint(*absSteadyTime);
        timeout = &ts;
    }

    // Unlike FUTEX_WAIT, FUTEX_WAIT_BITSET requires an absolute timeout
    // value - http://locklessinc.com/articles/futex_cheat_sheet/
    int rv = syscall(
            __NR_futex,
            addr, /* addr1 */
            op, /* op */
            expected, /* val */
            timeout, /* timeout */
            nullptr, /* addr2 */
            waitMask); /* val3 */

    if (rv == 0) {
        return FutexResult::AWOKEN;
    } else {
        switch (errno) {
            case ETIMEDOUT:
                assert(timeout != nullptr);
                return FutexResult::TIMEDOUT;
            case EINTR:
                return FutexResult::INTERRUPTED;
            case EWOULDBLOCK:
                return FutexResult::VALUE_CHANGED;
            default:
                assert(false);
                // EINVAL, EACCESS, or EFAULT.  EINVAL means there was an invalid
                // op (should be impossible) or an invalid timeout (should have
                // been sanitized by timeSpecFromTimePoint).  EACCESS or EFAULT
                // means *addr points to invalid memory, which is unlikely because
                // the caller should have segfaulted already.  We can either
                // crash, or return a value that lets the process continue for
                // a bit. We choose the latter. VALUE_CHANGED probably turns the
                // caller into a spin lock.
                return FutexResult::VALUE_CHANGED;
        }
    }
}